

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<unsigned_int,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint uVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  RLEScanState<unsigned_int> *scan_state;
  ulong uVar7;
  ulong uVar8;
  uint *data_pointer;
  ulong uVar9;
  idx_t iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  rle_count_t *index_pointer;
  int iVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  
  scan_state = (RLEScanState<unsigned_int> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar2 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (uint *)(pdVar2 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar2 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<unsigned_int>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar6 = _DAT_01df1090;
  auVar5 = _DAT_01df1070;
  auVar4 = _DAT_01de8e80;
  uVar9 = scan_count + result_offset;
  do {
    uVar7 = uVar9 - result_offset;
    if (uVar9 < result_offset || uVar7 == 0) {
      return;
    }
    iVar3 = scan_state->entry_pos;
    iVar10 = scan_state->position_in_entry;
    uVar8 = index_pointer[iVar3] - iVar10;
    uVar1 = data_pointer[iVar3];
    if (uVar7 < uVar8) {
      lVar11 = uVar7 + (uVar7 == 0);
      lVar12 = lVar11 + -1;
      auVar15._8_4_ = (int)lVar12;
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
      lVar12 = result_offset * 4;
      auVar15 = auVar15 ^ auVar4;
      uVar13 = 0;
      auVar19 = auVar5;
      auVar21 = auVar6;
      do {
        auVar20 = auVar19 ^ auVar4;
        iVar16 = auVar15._4_4_;
        if ((bool)(~(auVar20._4_4_ == iVar16 && auVar15._0_4_ < auVar20._0_4_ ||
                    iVar16 < auVar20._4_4_) & 1)) {
          *(uint *)(pdVar2 + uVar13 * 4 + lVar12) = uVar1;
        }
        if ((auVar20._12_4_ != auVar15._12_4_ || auVar20._8_4_ <= auVar15._8_4_) &&
            auVar20._12_4_ <= auVar15._12_4_) {
          *(uint *)(pdVar2 + uVar13 * 4 + lVar12 + 4) = uVar1;
        }
        iVar22 = SUB164(auVar21 ^ auVar4,4);
        if (iVar22 <= iVar16 && (iVar22 != iVar16 || SUB164(auVar21 ^ auVar4,0) <= auVar15._0_4_)) {
          *(uint *)(pdVar2 + uVar13 * 4 + lVar12 + 8) = uVar1;
          *(uint *)(pdVar2 + uVar13 * 4 + lVar12 + 0xc) = uVar1;
        }
        uVar13 = uVar13 + 4;
        lVar17 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 4;
        auVar19._8_8_ = lVar17 + 4;
        lVar17 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar17 + 4;
      } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar13);
      iVar10 = iVar10 + uVar7;
    }
    else {
      if (index_pointer[iVar3] != iVar10) {
        lVar12 = uVar8 - 1;
        auVar14._8_4_ = (int)lVar12;
        auVar14._0_8_ = lVar12;
        auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
        lVar12 = result_offset * 4;
        uVar13 = 0;
        auVar20 = auVar5;
        auVar18 = auVar6;
        do {
          auVar19 = auVar14 ^ auVar4;
          auVar21 = auVar20 ^ auVar4;
          iVar16 = auVar19._4_4_;
          if ((bool)(~(iVar16 < auVar21._4_4_ ||
                      auVar19._0_4_ < auVar21._0_4_ && auVar21._4_4_ == iVar16) & 1)) {
            *(uint *)(pdVar2 + uVar13 * 4 + lVar12) = uVar1;
          }
          if (auVar21._12_4_ <= auVar19._12_4_ &&
              (auVar21._8_4_ <= auVar19._8_4_ || auVar21._12_4_ != auVar19._12_4_)) {
            *(uint *)(pdVar2 + uVar13 * 4 + lVar12 + 4) = uVar1;
          }
          iVar22 = SUB164(auVar18 ^ auVar4,4);
          if (iVar22 <= iVar16 && (iVar22 != iVar16 || SUB164(auVar18 ^ auVar4,0) <= auVar19._0_4_))
          {
            *(uint *)(pdVar2 + uVar13 * 4 + lVar12 + 8) = uVar1;
            *(uint *)(pdVar2 + uVar13 * 4 + lVar12 + 0xc) = uVar1;
          }
          uVar13 = uVar13 + 4;
          lVar11 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar11 + 4;
          lVar11 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 4;
          auVar18._8_8_ = lVar11 + 4;
        } while ((uVar8 + 3 & 0xfffffffffffffffc) != uVar13);
      }
      result_offset = result_offset + uVar8;
      scan_state->entry_pos = iVar3 + 1;
      iVar10 = 0;
    }
    scan_state->position_in_entry = iVar10;
  } while (uVar8 <= uVar7);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}